

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

bool __thiscall
HighsHashTree<std::pair<int,_int>,_double>::contains
          (HighsHashTree<std::pair<int,_int>,_double> *this,pair<int,_int> *key)

{
  u64 hash;
  ValueType *pVVar1;
  
  hash = HighsHashHelpers::hash<std::pair<int,_int>,_0>(key);
  pVVar1 = find_recurse((NodePtr)(this->root).ptrAndType,hash,0,key);
  return pVVar1 != (ValueType *)0x0;
}

Assistant:

bool contains(const K& key) const {
    uint64_t hash = compute_hash(key);
    return find_recurse(root, hash, 0, key) != nullptr;
  }